

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O0

int Ivy_ManCheck(Ivy_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Ivy_Init_t IVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pIVar9;
  uint local_2c;
  int i;
  Ivy_Obj_t *pObj2;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= (int)local_2c) {
      iVar1 = Ivy_TableCountEntries(p);
      iVar6 = Ivy_ManAndNum(p);
      iVar7 = Ivy_ManExorNum(p);
      iVar8 = Ivy_ManLatchNum(p);
      if (iVar1 == iVar6 + iVar7 + iVar8) {
        iVar1 = Ivy_ManIsAcyclic(p);
        if (iVar1 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        printf("Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.\n");
        p_local._4_4_ = 0;
      }
      return p_local._4_4_;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (pObj_00 != (Ivy_Obj_t *)0x0) {
      uVar2 = Ivy_ObjId(pObj_00);
      if (uVar2 != local_2c) {
        printf("Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n",
               (ulong)(uint)pObj_00->Id,(ulong)local_2c);
        return 0;
      }
      if ((local_2c == 0) || (iVar1 = Ivy_ObjIsPi(pObj_00), iVar1 != 0)) {
        iVar1 = Ivy_ObjFaninId0(pObj_00);
        if ((iVar1 != 0) ||
           ((iVar1 = Ivy_ObjFaninId1(pObj_00), iVar1 != 0 ||
            (iVar1 = Ivy_ObjLevel(pObj_00), iVar1 != 0)))) {
          printf("Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n",
                 (ulong)(uint)pObj_00->Id);
          return 0;
        }
      }
      else {
        iVar1 = Ivy_ObjIsPo(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Ivy_ObjIsBuf(pObj_00);
          if (iVar1 == 0) {
            iVar1 = Ivy_ObjIsLatch(pObj_00);
            if (iVar1 == 0) {
              pIVar9 = Ivy_ObjFanin0(pObj_00);
              if ((pIVar9 == (Ivy_Obj_t *)0x0) ||
                 (pIVar9 = Ivy_ObjFanin1(pObj_00), pIVar9 == (Ivy_Obj_t *)0x0)) {
                printf("Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n",
                       (ulong)(uint)pObj_00->Id);
                return 0;
              }
              iVar1 = Ivy_ObjFaninId0(pObj_00);
              iVar6 = Ivy_ObjFaninId1(pObj_00);
              if (iVar6 <= iVar1) {
                printf("Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n",
                       (ulong)(uint)pObj_00->Id);
                return 0;
              }
              iVar1 = Ivy_ObjLevel(pObj_00);
              iVar6 = Ivy_ObjLevelNew(pObj_00);
              if (iVar1 != iVar6) {
                uVar2 = pObj_00->Id;
                uVar4 = Ivy_ObjLevel(pObj_00);
                uVar5 = Ivy_ObjLevelNew(pObj_00);
                printf("Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n",
                       (ulong)uVar2,(ulong)uVar4,(ulong)uVar5);
              }
              pIVar9 = Ivy_TableLookup(p,pObj_00);
              if (pIVar9 != pObj_00) {
                printf("Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n"
                       ,(ulong)(uint)pObj_00->Id);
              }
              iVar1 = Ivy_ObjRefs(pObj_00);
              if (iVar1 == 0) {
                printf("Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n",
                       (ulong)(uint)pObj_00->Id);
              }
              if (p->fFanout != 0) {
                iVar1 = Ivy_ObjRefs(pObj_00);
                iVar6 = Ivy_ObjFanoutNum(p,pObj_00);
                if (iVar1 != iVar6) {
                  printf("Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n"
                         ,(ulong)(uint)pObj_00->Id);
                }
              }
            }
            else {
              pIVar9 = Ivy_ObjFanin1(pObj_00);
              if (pIVar9 != (Ivy_Obj_t *)0x0) {
                printf("Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n",
                       (ulong)(uint)pObj_00->Id);
                return 0;
              }
              IVar3 = Ivy_ObjInit(pObj_00);
              if (IVar3 == IVY_INIT_NONE) {
                printf("Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n",
                       (ulong)(uint)pObj_00->Id);
                return 0;
              }
              pIVar9 = Ivy_TableLookup(p,pObj_00);
              if (pIVar9 != pObj_00) {
                printf("Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n"
                       ,(ulong)(uint)pObj_00->Id);
              }
            }
          }
          else {
            pIVar9 = Ivy_ObjFanin1(pObj_00);
            if (pIVar9 != (Ivy_Obj_t *)0x0) {
              printf("Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n",
                     (ulong)(uint)pObj_00->Id);
              return 0;
            }
          }
        }
        else {
          iVar1 = Ivy_ObjFaninId1(pObj_00);
          if (iVar1 != 0) {
            printf("Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n",
                   (ulong)(uint)pObj_00->Id);
            return 0;
          }
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ivy_ManCheck( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pObj2;
    int i;
    Ivy_ManForEachObj( p, pObj, i )
    {
        // skip deleted nodes
        if ( Ivy_ObjId(pObj) != i )
        {
            printf( "Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n", pObj->Id, i );
            return 0;
        }
        // consider the constant node and PIs
        if ( i == 0 || Ivy_ObjIsPi(pObj) )
        {
            if ( Ivy_ObjFaninId0(pObj) || Ivy_ObjFaninId1(pObj) || Ivy_ObjLevel(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsPo(pObj) )
        {
            if ( Ivy_ObjFaninId1(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsBuf(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsLatch(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            if ( Ivy_ObjInit(pObj) == IVY_INIT_NONE )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n", pObj->Id );
                return 0;
            }
            pObj2 = Ivy_TableLookup( p, pObj );
            if ( pObj2 != pObj )
                printf( "Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
            continue;
        }
        // consider the AND node
        if ( !Ivy_ObjFanin0(pObj) || !Ivy_ObjFanin1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjFaninId0(pObj) >= Ivy_ObjFaninId1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjLevel(pObj) != Ivy_ObjLevelNew(pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n", pObj->Id, Ivy_ObjLevel(pObj), Ivy_ObjLevelNew(pObj) );
        pObj2 = Ivy_TableLookup( p, pObj );
        if ( pObj2 != pObj )
            printf( "Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
        if ( Ivy_ObjRefs(pObj) == 0 )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n", pObj->Id );
        // check fanouts
        if ( p->fFanout && Ivy_ObjRefs(pObj) != Ivy_ObjFanoutNum(p, pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n", pObj->Id );
    }
    // count the number of nodes in the table
    if ( Ivy_TableCountEntries(p) != Ivy_ManAndNum(p) + Ivy_ManExorNum(p) + Ivy_ManLatchNum(p) )
    {
        printf( "Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Ivy_ManCheckFanouts(p) )
//        return 0;
    if ( !Ivy_ManIsAcyclic(p) )
        return 0;
    return 1; 
}